

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t
exr_get_scanlines_per_chunk(exr_const_context_t_conflict ctxt,int part_index,int32_t *out)

{
  long lVar1;
  int iVar2;
  exr_const_context_t_conflict in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_RDX);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_RDX);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (exr_const_context_t_conflict)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock((exr_const_context_t_conflict)0x0);
        }
        local_4 = 3;
      }
      else if ((*(int *)(lVar1 + 4) == 0) || (*(int *)(lVar1 + 4) == 2)) {
        iVar2 = (int)*(short *)(lVar1 + 0xf0);
        in_RDX->mode = (char)iVar2;
        in_RDX->version = (char)((uint)iVar2 >> 8);
        in_RDX->max_name_length = (char)((uint)iVar2 >> 0x10);
        in_RDX->is_singlepart_tiled = (char)((uint)iVar2 >> 0x18);
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = 0;
      }
      else {
        in_RDX->mode = 0xff;
        in_RDX->version = 0xff;
        in_RDX->max_name_length = 0xff;
        in_RDX->is_singlepart_tiled = 0xff;
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x12);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_scanlines_per_chunk (
    exr_const_context_t ctxt, int part_index, int32_t* out)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!out) return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        *out = part->lines_per_chunk;
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }
    *out = -1;
    return EXR_UNLOCK_WRITE_AND_RETURN (
        ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI));
}